

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumConstantOptions
          (Parser *this,EnumValueDescriptorProto *value,LocationRecorder *enum_value_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  int iVar2;
  EnumValueOptions *pEVar3;
  Arena *arena;
  string_view text;
  string_view text_00;
  string_view text_01;
  LocationRecorder location;
  LocationRecorder LStack_48;
  
  bVar1 = true;
  if (((this->input_->current_).text._M_string_length == 1) &&
     (iVar2 = bcmp((this->input_->current_).text._M_dataplus._M_p,"[",1), iVar2 == 0)) {
    LocationRecorder::Init(&LStack_48,enum_value_location,enum_value_location->source_code_info_);
    RepeatedField<int>::Add(&((LStack_48.location_)->field_0)._impl_.path_,3);
    text._M_str = "[";
    text._M_len = 1;
    bVar1 = Consume(this,text);
    if (bVar1) {
      do {
        *(byte *)&value->field_0 = *(byte *)&value->field_0 | 2;
        if ((value->field_0)._impl_.options_ == (EnumValueOptions *)0x0) {
          arena = (Arena *)(value->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)arena & 1) != 0) {
            arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
          }
          pEVar3 = (EnumValueOptions *)
                   Arena::DefaultConstruct<google::protobuf::EnumValueOptions>(arena);
          (value->field_0)._impl_.options_ = pEVar3;
        }
        bVar1 = ParseOption(this,&((value->field_0)._impl_.options_)->super_Message,&LStack_48,
                            containing_file,OPTION_ASSIGNMENT);
        if (!bVar1) goto LAB_003851ec;
        text_00._M_str = ",";
        text_00._M_len = 1;
        bVar1 = TryConsume(this,text_00);
      } while (bVar1);
      text_01._M_str = "]";
      text_01._M_len = 1;
      bVar1 = Consume(this,text_01);
    }
    else {
LAB_003851ec:
      bVar1 = false;
    }
    LocationRecorder::~LocationRecorder(&LStack_48);
  }
  return bVar1;
}

Assistant:

bool Parser::ParseEnumConstantOptions(
    EnumValueDescriptorProto* value,
    const LocationRecorder& enum_value_location,
    const FileDescriptorProto* containing_file) {
  if (!LookingAt("[")) return true;

  LocationRecorder location(enum_value_location,
                            EnumValueDescriptorProto::kOptionsFieldNumber);

  DO(Consume("["));

  do {
    DO(ParseOption(value->mutable_options(), location, containing_file,
                   OPTION_ASSIGNMENT));
  } while (TryConsume(","));

  DO(Consume("]"));
  return true;
}